

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_luma_planar
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar3 = nt << 0x1e | nt - 4U >> 2;
  bVar1 = 6;
  if (uVar3 < 4) {
    bVar1 = (byte)*(undefined4 *)(&DAT_00174170 + (ulong)uVar3 * 4);
  }
  if (0 < nt) {
    uVar2 = (ulong)(uint)nt;
    uVar3 = nt - 1;
    uVar7 = 0;
    do {
      uVar8 = ~uVar7;
      iVar6 = (int)uVar7;
      uVar7 = uVar7 + 1;
      uVar4 = 1;
      uVar5 = uVar3;
      do {
        pu1_dst[uVar4 - 1] =
             (UWORD8)((int)(pu1_ref[uVar8 + uVar2 * 2] * uVar5 + nt +
                            (uint)pu1_ref[uVar4 + uVar2 * 2] * (uVar3 - iVar6) +
                            (uint)pu1_ref[uVar2 * 3 + 1] * (int)uVar4 +
                           (uint)pu1_ref[uVar3] * (int)uVar7) >> (bVar1 & 0x1f));
        uVar5 = uVar5 - 1;
        bVar9 = uVar4 != uVar2;
        uVar4 = uVar4 + 1;
      } while (bVar9);
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar7 != uVar2);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar(UWORD8 *pu1_ref,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_dst,
                                  WORD32 dst_strd,
                                  WORD32 nt,
                                  WORD32 mode)
{


    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(src_strd);
    UNUSED(mode);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;
    /* Planar filtering */
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < nt; col++)
        {
            pu1_dst[row * dst_strd + col] = ((nt - 1 - col)
                            * pu1_ref[two_nt - 1 - row]
                            + (col + 1) * pu1_ref[three_nt + 1]
                            + (nt - 1 - row) * pu1_ref[two_nt + 1 + col]
                            + (row + 1) * pu1_ref[nt - 1] + nt) >> (log2nt + 1);
        }
    }
}